

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingTest.cpp
# Opt level: O2

void other(void)

{
  char *pcVar1;
  ostream *poVar2;
  LogStream *pLVar3;
  char **ppcVar4;
  Logger local_1018;
  void *local_40;
  size_t local_38;
  allocator local_19;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"----------other test-----------");
  std::endl<char,std::char_traits<char>>(poVar2);
  tt::Logger::Logger(&local_1018,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/HhTtLllL[P]web_server/h_webserver/base/tests/LoggingTest.cpp"
                     ,0x49);
  pLVar3 = tt::LogStream::operator<<((LogStream *)&local_1018,"fddsa");
  ppcVar4 = &(pLVar3->m_buffer).m_cur;
  pcVar1 = (pLVar3->m_buffer).m_cur;
  if (1 < (int)ppcVar4 - (int)pcVar1) {
    *pcVar1 = 'c';
    *ppcVar4 = *ppcVar4 + 1;
  }
  pLVar3 = tt::LogStream::operator<<(pLVar3,0);
  pLVar3 = tt::LogStream::operator<<(pLVar3,3.666);
  std::__cxx11::string::string((string *)&local_40,"This is a string",&local_19);
  ppcVar4 = &(pLVar3->m_buffer).m_cur;
  pcVar1 = (pLVar3->m_buffer).m_cur;
  if ((int)local_38 < (int)ppcVar4 - (int)pcVar1) {
    memcpy(pcVar1,local_40,local_38);
    *ppcVar4 = *ppcVar4 + local_38;
  }
  std::__cxx11::string::~string((string *)&local_40);
  tt::Logger::~Logger(&local_1018);
  return;
}

Assistant:

void other()
{
    // 1 line
    cout << "----------other test-----------" << endl;
    LOG << "fddsa" << 'c' << 0 << 3.666 << string("This is a string");
}